

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O3

void __thiscall
TEST_WiningStateTest_ReadyHand_Test::testBody(TEST_WiningStateTest_ReadyHand_Test *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  _Base_ptr p_Var4;
  UtestShell *pUVar5;
  char *pcVar6;
  char *pcVar7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  SimpleString local_b8;
  SimpleString local_b0;
  TestTerminatorWithoutExceptions local_a8;
  DoublingFactorReport r;
  
  TEST_GROUP_CppUTestGroupWiningStateTest::addNoWiningHand
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,false);
  mahjong::PlayerHand::readyHand(&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h);
  mahjong::WiningState::winByDiscard
            (&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).s,(WinByDiscardSituation)0x0);
  mahjong::DoubligFactorCounter::report(&r,&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c)
  ;
  p_Var1 = &r.patterns._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = &p_Var1->_M_header;
  p_Var4 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    do {
      p_Var9 = p_Var4;
      p_Var11 = p_Var10;
      _Var2 = p_Var9[1]._M_color;
      p_Var10 = p_Var9;
      if ((int)_Var2 < 1) {
        p_Var10 = p_Var11;
      }
      p_Var4 = (&p_Var9->_M_left)[(int)_Var2 < 1];
    } while ((&p_Var9->_M_left)[(int)_Var2 < 1] != (_Base_ptr)0x0);
    p_Var4 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      if ((int)_Var2 < 1) {
        p_Var9 = p_Var11;
      }
      if ((int)p_Var9[1]._M_color < 2) {
        pUVar5 = UtestShell::getCurrent();
        local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
        (*pUVar5->_vptr_UtestShell[0xe])
                  (pUVar5,0,0,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                   ,0x74,&local_b8);
        TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
                  ((TestTerminatorWithoutExceptions *)&local_b8);
        goto LAB_00190b4c;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var13;
      p_Var10 = p_Var4;
      iVar3 = (int)*(size_t *)(p_Var10 + 1);
      p_Var13 = p_Var10;
      if (iVar3 < 1) {
        p_Var13 = &p_Var12->_M_header;
      }
      p_Var4 = (&p_Var10->_M_left)[iVar3 < 1];
    } while ((&p_Var10->_M_left)[iVar3 < 1] != (_Base_ptr)0x0);
    p_Var4 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var9 = &p_Var1->_M_header;
    p_Var8 = p_Var1;
    if ((_Rb_tree_header *)p_Var13 != p_Var1) {
      if (iVar3 < 1) {
        p_Var10 = &p_Var12->_M_header;
      }
      p_Var8 = (_Rb_tree_header *)p_Var13;
      if (1 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count) {
        p_Var8 = p_Var1;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var9;
      p_Var10 = p_Var4;
      iVar3 = (int)*(size_t *)(p_Var10 + 1);
      p_Var9 = p_Var10;
      if (iVar3 < 1) {
        p_Var9 = &p_Var12->_M_header;
      }
      p_Var4 = (&p_Var10->_M_left)[iVar3 < 1];
    } while ((&p_Var10->_M_left)[iVar3 < 1] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var9 == p_Var1) {
      if (p_Var8 != p_Var1) goto LAB_00190a43;
    }
    else {
      if (iVar3 < 1) {
        p_Var10 = &p_Var12->_M_header;
      }
      if (1 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count == (p_Var8 != p_Var1)) {
LAB_00190a43:
        pUVar5 = UtestShell::getCurrent();
        (*pUVar5->_vptr_UtestShell[0x1b])
                  (pUVar5,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                   ,0x74);
      }
    }
  }
  pUVar5 = UtestShell::getCurrent();
  StringFrom((int)&local_b8);
  pcVar6 = SimpleString::asCharString(&local_b8);
  for (; r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0;
      r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&(r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
           [(int)r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_color < 1])
  {
  }
  StringFrom((unsigned_long)&local_b0);
  pcVar7 = SimpleString::asCharString(&local_b0);
  local_a8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)&PTR_exitCurrentTest_001e18b8
  ;
  (*pUVar5->_vptr_UtestShell[0x16])
            (pUVar5,1,pcVar6,pcVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
             ,0x74,&local_a8);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_b8);
LAB_00190b4c:
  if (r.doubling_factor == 1) {
    pUVar5 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x75,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_b8);
    pcVar6 = SimpleString::asCharString(&local_b8);
    StringFrom((int)&local_b0);
    pcVar7 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x75,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&r.patterns._M_t);
  if (r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(r.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&r.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&r);
  return;
}

Assistant:

TEST(WiningStateTest, ReadyHand)
{
	addNoWiningHand();

	h.readyHand();	
	winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ReadyHand));
	CHECK_EQUAL(1, r.doubling_factor);
}